

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O2

string * __thiscall
cmGeneratorExpressionInterpreter::Evaluate
          (cmGeneratorExpressionInterpreter *this,char *expression,string *property)

{
  cmGeneratorTarget *target;
  cmGeneratorExpressionDAGChecker *__p;
  bool bVar1;
  string *psVar2;
  cmGeneratorExpressionDAGChecker dagChecker;
  allocator<char> local_c1;
  string local_c0;
  cmGeneratorExpressionDAGChecker local_a0;
  
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&local_a0,(char *)this);
  __p = local_a0.Parent;
  local_a0.Parent = (cmGeneratorExpressionDAGChecker *)0x0;
  std::
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ::reset((__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           *)&this->CompiledGeneratorExpression,(pointer)__p);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&local_a0);
  target = this->HeadTarget;
  bVar1 = std::operator==(property,"COMPILE_FLAGS");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"COMPILE_OPTIONS",&local_c1);
  }
  else {
    std::__cxx11::string::string((string *)&local_c0,(string *)property);
  }
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&local_a0,target,&local_c0,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  std::__cxx11::string::~string((string *)&local_c0);
  psVar2 = cmCompiledGeneratorExpression::Evaluate
                     ((this->CompiledGeneratorExpression)._M_t.
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                      this->LocalGenerator,&this->Config,false,this->HeadTarget,&local_a0,
                      &this->Language);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&local_a0);
  return psVar2;
}

Assistant:

const std::string& cmGeneratorExpressionInterpreter::Evaluate(
  const char* expression, const std::string& property)
{
  this->CompiledGeneratorExpression =
    this->GeneratorExpression.Parse(expression);

  // Specify COMPILE_OPTIONS to DAGchecker, same semantic as COMPILE_FLAGS
  cmGeneratorExpressionDAGChecker dagChecker(
    this->HeadTarget,
    property == "COMPILE_FLAGS" ? "COMPILE_OPTIONS" : property, nullptr,
    nullptr);

  return this->CompiledGeneratorExpression->Evaluate(
    this->LocalGenerator, this->Config, false, this->HeadTarget, &dagChecker,
    this->Language);
}